

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void Curl_http_method(Curl_easy *data,connectdata *conn,char **method,Curl_HttpReq *reqp)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  
  bVar1 = (data->state).httpreq;
  bVar2 = bVar1;
  if ((conn->handler->protocol & 0xc0000007) != 0) {
    bVar2 = 4;
    if (((data->state).field_0x7c0 & 8) == 0) {
      bVar2 = bVar1;
    }
  }
  pcVar3 = (data->set).str[0x1c];
  if ((pcVar3 == (char *)0x0) || (((data->state).field_0x7c0 & 0x20) != 0)) {
    if (((data->req).field_0xd3 & 2) == 0) {
      if ((byte)(bVar2 - 1) < 5) {
        pcVar3 = &DAT_00176018 + *(int *)(&DAT_00176018 + (ulong)(byte)(bVar2 - 1) * 4);
      }
      else {
        pcVar3 = "GET";
      }
    }
    else {
      pcVar3 = "HEAD";
    }
  }
  *method = pcVar3;
  *reqp = (uint)bVar2;
  return;
}

Assistant:

void Curl_http_method(struct Curl_easy *data, struct connectdata *conn,
                      const char **method, Curl_HttpReq *reqp)
{
  Curl_HttpReq httpreq = (Curl_HttpReq)data->state.httpreq;
  const char *request;
  if((conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_FTP)) &&
     data->state.upload)
    httpreq = HTTPREQ_PUT;

  /* Now set the 'request' pointer to the proper request string */
  if(data->set.str[STRING_CUSTOMREQUEST] &&
     !data->state.http_ignorecustom) {
    request = data->set.str[STRING_CUSTOMREQUEST];
  }
  else {
    if(data->req.no_body)
      request = "HEAD";
    else {
      DEBUGASSERT((httpreq >= HTTPREQ_GET) && (httpreq <= HTTPREQ_HEAD));
      switch(httpreq) {
      case HTTPREQ_POST:
      case HTTPREQ_POST_FORM:
      case HTTPREQ_POST_MIME:
        request = "POST";
        break;
      case HTTPREQ_PUT:
        request = "PUT";
        break;
      default: /* this should never happen */
      case HTTPREQ_GET:
        request = "GET";
        break;
      case HTTPREQ_HEAD:
        request = "HEAD";
        break;
      }
    }
  }
  *method = request;
  *reqp = httpreq;
}